

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImDrawList::~ImDrawList(ImDrawList *this)

{
  ImDrawList *in_RDI;
  
  _ClearFreeMemory(in_RDI);
  ImDrawListSplitter::~ImDrawListSplitter((ImDrawListSplitter *)in_RDI);
  ImVector<ImVec2>::~ImVector((ImVector<ImVec2> *)in_RDI);
  ImVector<void_*>::~ImVector((ImVector<void_*> *)in_RDI);
  ImVector<ImVec4>::~ImVector((ImVector<ImVec4> *)in_RDI);
  ImVector<ImDrawVert>::~ImVector((ImVector<ImDrawVert> *)in_RDI);
  ImVector<unsigned_short>::~ImVector((ImVector<unsigned_short> *)in_RDI);
  ImVector<ImDrawCmd>::~ImVector(&in_RDI->CmdBuffer);
  return;
}

Assistant:

~ImDrawList() { _ClearFreeMemory(); }